

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O0

bool __thiscall FIX::Acceptor::isLoggedOn(Acceptor *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_58;
  _Self local_50;
  iterator i;
  Sessions sessions;
  Acceptor *this_local;
  
  std::
  map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
  ::map((map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
         *)&i,&this->m_sessions);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
       ::begin((map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
                *)&i);
  do {
    local_58._M_node =
         (_Base_ptr)
         std::
         map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
         ::end((map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
                *)&i);
    bVar1 = std::operator!=(&local_50,&local_58);
    if (!bVar1) {
      this_local._7_1_ = false;
LAB_001ea159:
      std::
      map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
      ::~map((map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
              *)&i);
      return this_local._7_1_;
    }
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>::operator->
                       (&local_50);
    bVar1 = Session::isLoggedOn(ppVar2->second);
    if (bVar1) {
      this_local._7_1_ = true;
      goto LAB_001ea159;
    }
    std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>::operator++(&local_50);
  } while( true );
}

Assistant:

bool Acceptor::isLoggedOn()
{
  Sessions sessions = m_sessions;
  Sessions::iterator i = sessions.begin();
  for ( ; i != sessions.end(); ++i )
  {
    if( i->second->isLoggedOn() )
      return true;
  }
  return false;
}